

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tests.cpp
# Opt level: O1

void __thiscall serialize_tests::with_params_move::test_method(with_params_move *this)

{
  int iVar1;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  Span<const_std::byte> sp;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  Base base2;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  Base base1;
  lazy_ostream local_168;
  undefined1 *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  ParamsStream<ParamsStream<ParamsStream<serialize_tests::UncopyableStream,_serialize_tests::BaseFormat>,_serialize_tests::BaseFormat>,_serialize_tests::BaseFormat>
  pstream;
  UncopyableStream stream;
  undefined1 local_d0 [24];
  assertion_result local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  undefined **local_98;
  undefined1 local_90;
  undefined1 *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_80;
  undefined **local_78;
  undefined1 local_70;
  undefined1 *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  sp.m_size = 3;
  sp.m_data = (byte *)0xf9ce6b;
  DataStream::DataStream(&stream.super_DataStream,sp);
  pvVar2 = "";
  ParamsStream<ParamsStream<ParamsStream<serialize_tests::UncopyableStream,serialize_tests::BaseFormat>,serialize_tests::BaseFormat>,serialize_tests::BaseFormat>
  ::
  ParamsStream<serialize_tests::UncopyableStream,serialize_tests::BaseFormat,serialize_tests::BaseFormat,serialize_tests::BaseFormat>
            ((ParamsStream<ParamsStream<ParamsStream<serialize_tests::UncopyableStream,serialize_tests::BaseFormat>,serialize_tests::BaseFormat>,serialize_tests::BaseFormat>
              *)&pstream,(UncopyableStream *)&stream.super_DataStream,(BaseFormat *)&RAW,
             (BaseFormat *)&HEX,(BaseFormat *)&RAW);
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x1a1;
  file.m_begin = (iterator)&local_138;
  msg.m_end = in_R9;
  msg.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_148,msg);
  local_168.m_empty = false;
  local_168._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = "";
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<unsigned_char_const*>
            ((string *)&local_58,
             pstream.m_substream.m_substream.m_substream.super_DataStream.vch.
             super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start +
             pstream.m_substream.m_substream.m_substream.super_DataStream.m_read_pos,
             pstream.m_substream.m_substream.m_substream.super_DataStream.vch.
             super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish);
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_58,"abc");
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar1 == 0);
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0._8_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_d0._16_8_ =
       (long)
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
       + 0x61;
  local_60 = &local_a0;
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_013d3d70;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_d0;
  local_d0._0_8_ = "abc";
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_013d44b0;
  local_88 = boost::unit_test::lazy_ostream::inst;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  local_a0 = &local_58;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_168,1,2,REQUIRE,0xf35949,(size_t)(local_d0 + 8),0x1a1,&local_78,
             "\"abc\"",&local_98);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (pstream.m_substream.m_substream.m_substream.super_DataStream.vch.
      super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      pstream.m_substream.m_substream.m_substream.super_DataStream.vch.
      super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pstream.m_substream.m_substream.m_substream.super_DataStream.vch.
    super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish =
         pstream.m_substream.m_substream.m_substream.super_DataStream.vch.
         super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  pstream.m_substream.m_substream.m_substream.super_DataStream.m_read_pos = 0;
  base1.m_base_data = ' ';
  Base::
  Serialize<ParamsStream<ParamsStream<ParamsStream<serialize_tests::UncopyableStream,serialize_tests::BaseFormat>,serialize_tests::BaseFormat>,serialize_tests::BaseFormat>>
            (&base1,&pstream);
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x1a6;
  file_00.m_begin = (iterator)&local_180;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_190,
             msg_00);
  local_168.m_empty = false;
  local_168._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = "";
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<unsigned_char_const*>
            ((string *)&local_58,
             pstream.m_substream.m_substream.m_substream.super_DataStream.vch.
             super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start +
             pstream.m_substream.m_substream.m_substream.super_DataStream.m_read_pos,
             pstream.m_substream.m_substream.m_substream.super_DataStream.vch.
             super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish);
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_58," ");
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar1 == 0);
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0._8_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_d0._16_8_ =
       (long)
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
       + 0x61;
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_013d3d70;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = &local_a0;
  local_d0._0_8_ = " ";
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_013d4430;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_d0;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  local_a0 = &local_58;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_168,1,2,REQUIRE,0xf35949,(size_t)(local_d0 + 8),0x1a6,&local_78,
             "\"\\x20\"",&local_98);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  base2.m_base_data = '\x11';
  Base::
  Unserialize<ParamsStream<ParamsStream<ParamsStream<serialize_tests::UncopyableStream,serialize_tests::BaseFormat>,serialize_tests::BaseFormat>,serialize_tests::BaseFormat>>
            (&base2,&pstream);
  local_1a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_1a0 = "";
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x1aa;
  file_01.m_begin = (iterator)&local_1a8;
  msg_01.m_end = pvVar3;
  msg_01.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1b8,
             msg_01);
  local_168.m_empty = false;
  local_168._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = "";
  local_d0._0_4_ = 0x20;
  local_58._M_dataplus._M_p._0_1_ = base2.m_base_data == ' ';
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity = 0;
  local_b8._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_b8.m_message.px = (element_type *)0xf35401;
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_013d4aa0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_013d3e70;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = &local_a0;
  local_d0._8_8_ = &base2;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(local_d0 + 8);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,&local_168,1,2,REQUIRE,0xf35921,(size_t)&local_b8,0x1aa,
             &local_78,"0x20",&local_98);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_58.field_2._M_allocated_capacity);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)
             &pstream.m_substream.m_substream.m_substream);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&stream);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(with_params_move)
{
    UncopyableStream stream{MakeByteSpan(std::string_view{"abc"})};
    ParamsStream pstream{std::move(stream), RAW, HEX, RAW};
    BOOST_CHECK_EQUAL(pstream.GetStream().str(), "abc");
    pstream.GetStream().clear();

    Base base1{0x20};
    pstream << base1;
    BOOST_CHECK_EQUAL(pstream.GetStream().str(), "\x20");

    Base base2;
    pstream >> base2;
    BOOST_CHECK_EQUAL(base2.m_base_data, 0x20);
}